

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

BCLine lj_debug_line(GCproto *pt,BCPos pc)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (pt->lineinfo).ptr32;
  iVar1 = 0;
  if (uVar2 != 0 && pc <= pt->sizebc) {
    iVar1 = pt->firstline;
    if (pt->sizebc == pc) {
      return iVar1 + pt->numline;
    }
    if (pc != 0) {
      uVar3 = (ulong)uVar2;
      uVar4 = (ulong)(pc - 1);
      if (pt->numline < 0x100) {
        uVar2 = (uint)*(byte *)(uVar3 + uVar4);
      }
      else {
        if (0xffff < pt->numline) {
          return iVar1 + *(int *)(uVar3 + uVar4 * 4);
        }
        uVar2 = (uint)*(ushort *)(uVar3 + uVar4 * 2);
      }
      return iVar1 + uVar2;
    }
  }
  return iVar1;
}

Assistant:

BCLine LJ_FASTCALL lj_debug_line(GCproto *pt, BCPos pc)
{
  const void *lineinfo = proto_lineinfo(pt);
  if (pc <= pt->sizebc && lineinfo) {
    BCLine first = pt->firstline;
    if (pc == pt->sizebc) return first + pt->numline;
    if (pc-- == 0) return first;
    if (pt->numline < 256)
      return first + (BCLine)((const uint8_t *)lineinfo)[pc];
    else if (pt->numline < 65536)
      return first + (BCLine)((const uint16_t *)lineinfo)[pc];
    else
      return first + (BCLine)((const uint32_t *)lineinfo)[pc];
  }
  return 0;
}